

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

double matd_plu_det(matd_plu_t *mlu)

{
  uint uVar1;
  matd_t *pmVar2;
  ulong uVar3;
  uint uVar4;
  double dVar5;
  
  dVar5 = (double)mlu->pivsign;
  pmVar2 = mlu->lu;
  uVar1 = pmVar2->ncols;
  uVar3 = (ulong)uVar1;
  if (uVar1 != 0 && pmVar2->nrows == uVar1) {
    uVar4 = 0;
    do {
      dVar5 = dVar5 * (double)pmVar2[(ulong)uVar4 + 1];
      uVar4 = uVar4 + uVar1 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return dVar5;
}

Assistant:

double matd_plu_det(const matd_plu_t *mlu)
{
    matd_t *lu = mlu->lu;
    double det = mlu->pivsign;

    if (lu->nrows == lu->ncols) {
        for (int i = 0; i < lu->ncols; i++)
            det *= MATD_EL(lu, i, i);
    }

    return det;
}